

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_matplotlib.cc
# Opt level: O3

void lf::io::writeMatplotlib(Mesh *mesh,string *filename)

{
  long *plVar1;
  char cVar2;
  int iVar3;
  uint uVar4;
  undefined8 *puVar5;
  long *plVar6;
  MatrixXd *pMVar7;
  ostream *poVar8;
  CoeffReturnType pdVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar10;
  runtime_error *prVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  long extraout_RDX;
  ulong uVar14;
  long lVar15;
  undefined1 auVar16 [16];
  RefEl obj_ref_el;
  MatrixXd vertices;
  stringstream ss;
  ofstream file;
  RefEl local_4e9;
  ulong local_4e8;
  uint local_4dc;
  string local_4d8;
  string local_4b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_498;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_478;
  undefined8 *local_458;
  void *local_450 [3];
  string local_438;
  string local_418;
  string local_3f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d8;
  stringstream local_3b8 [16];
  ostream local_3a8 [376];
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  undefined4 extraout_var;
  
  iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (filename,filename->_M_string_length - 4,4,".csv");
  if (iVar3 != 0) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (filename,".csv");
  }
  std::ofstream::ofstream(&local_230,(string *)filename,_S_out);
  cVar2 = std::__basic_file<char>::is_open();
  if (cVar2 != '\0') {
    iVar3 = (**mesh->_vptr_Mesh)(mesh);
    if (iVar3 != 2) {
      std::__cxx11::stringstream::stringstream(local_3b8);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_3a8,"write_matplotlib() only available for 2D meshes",0x2f);
      local_4b8._M_dataplus._M_p = (pointer)&local_4b8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_4b8,"dim_mesh == 2","");
      local_4d8._M_dataplus._M_p = (pointer)&local_4d8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_4d8,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/io/write_matplotlib.cc"
                 ,"");
      std::__cxx11::stringbuf::str();
      base::AssertionFailed(&local_4b8,&local_4d8,0x1e,&local_498);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_498._M_dataplus._M_p != &local_498.field_2) {
        operator_delete(local_498._M_dataplus._M_p,local_498.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4d8._M_dataplus._M_p != &local_4d8.field_2) {
        operator_delete(local_4d8._M_dataplus._M_p,local_4d8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4b8._M_dataplus._M_p != &local_4b8.field_2) {
        operator_delete(local_4b8._M_dataplus._M_p,local_4b8.field_2._M_allocated_capacity + 1);
      }
      prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar11,"this code should not be reached");
      __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    uVar14 = 0;
    do {
      iVar3 = (*mesh->_vptr_Mesh[2])(mesh,uVar14);
      puVar5 = (undefined8 *)CONCAT44(extraout_var,iVar3);
      local_4dc = (int)uVar14 + 1;
      local_4e8 = uVar14;
      if (extraout_RDX != 0) {
        local_458 = puVar5 + extraout_RDX;
        do {
          plVar1 = (long *)*puVar5;
          uVar4 = (*mesh->_vptr_Mesh[5])(mesh,plVar1);
          local_4e9.type_ = (**(code **)(*plVar1 + 0x20))(plVar1);
          plVar6 = (long *)(**(code **)(*plVar1 + 0x18))(plVar1);
          pMVar7 = base::RefEl::NodeCoords(&local_4e9);
          (**(code **)(*plVar6 + 0x18))(local_450,plVar6,pMVar7);
          iVar3 = (int)local_4e8;
          if (local_4e9.type_ - 3 < 2) {
            poVar8 = (ostream *)std::ostream::operator<<(&local_230,iVar3);
            local_3b8[0] = (stringstream)0x2c;
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)local_3b8,1);
            poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
            local_3b8[0] = (stringstream)0x2c;
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)local_3b8,1);
            auVar16 = (**(code **)(*plVar1 + 8))(plVar1,local_4dc);
            if (auVar16._8_8_ != 0) {
              lVar15 = 0;
              do {
                (*mesh->_vptr_Mesh[5])(mesh,*(undefined8 *)(auVar16._0_8_ + lVar15));
                poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&local_230);
                local_3b8[0] = (stringstream)0x2c;
                std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)local_3b8,1);
                lVar15 = lVar15 + 8;
              } while (auVar16._8_8_ << 3 != lVar15);
            }
            local_3b8[0] = (stringstream)0xa;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_230,(char *)local_3b8,1);
          }
          else if (local_4e9.type_ == kPoint) {
            poVar8 = (ostream *)std::ostream::operator<<(&local_230,iVar3);
            local_3b8[0] = (stringstream)0x2c;
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)local_3b8,1);
            poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
            local_3b8[0] = (stringstream)0x2c;
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)local_3b8,1);
            pdVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::operator()
                               ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *)
                                local_450,0,0);
            poVar8 = std::ostream::_M_insert<double>(*pdVar9);
            local_3b8[0] = (stringstream)0x2c;
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)local_3b8,1);
            pdVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::operator()
                               ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *)
                                local_450,1,0);
            poVar8 = std::ostream::_M_insert<double>(*pdVar9);
            local_3b8[0] = (stringstream)0xa;
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)local_3b8,1);
          }
          else {
            if (local_4e9.type_ != kSegment) {
              std::__cxx11::stringstream::stringstream(local_3b8);
              std::__cxx11::to_string(&local_3f8,(ulong)uVar4);
              std::operator+(&local_3d8,"Error for object ",&local_3f8);
              pbVar10 = std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                  (&local_3d8," in codim ");
              local_478._M_dataplus._M_p = (pbVar10->_M_dataplus)._M_p;
              paVar12 = &pbVar10->field_2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_478._M_dataplus._M_p == paVar12) {
                local_478.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
                local_478.field_2._8_8_ = *(undefined8 *)((long)&pbVar10->field_2 + 8);
                local_478._M_dataplus._M_p = (pointer)&local_478.field_2;
              }
              else {
                local_478.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
              }
              local_478._M_string_length = pbVar10->_M_string_length;
              (pbVar10->_M_dataplus)._M_p = (pointer)paVar12;
              pbVar10->_M_string_length = 0;
              (pbVar10->field_2)._M_local_buf[0] = '\0';
              std::__cxx11::to_string(&local_418,(int)local_4e8);
              std::operator+(&local_498,&local_478,&local_418);
              pbVar10 = std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                  (&local_498," of type ");
              paVar12 = &local_4d8.field_2;
              local_4d8._M_dataplus._M_p = (pbVar10->_M_dataplus)._M_p;
              paVar13 = &pbVar10->field_2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4d8._M_dataplus._M_p == paVar13) {
                local_4d8.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
                local_4d8.field_2._8_8_ = *(undefined8 *)((long)&pbVar10->field_2 + 8);
                local_4d8._M_dataplus._M_p = (pointer)paVar12;
              }
              else {
                local_4d8.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
              }
              local_4d8._M_string_length = pbVar10->_M_string_length;
              (pbVar10->_M_dataplus)._M_p = (pointer)paVar13;
              pbVar10->_M_string_length = 0;
              (pbVar10->field_2)._M_local_buf[0] = '\0';
              base::RefEl::ToString_abi_cxx11_(&local_438,&local_4e9);
              std::operator+(&local_4b8,&local_4d8,&local_438);
              std::__ostream_insert<char,std::char_traits<char>>
                        (local_3a8,local_4b8._M_dataplus._M_p,local_4b8._M_string_length);
              paVar13 = &local_4b8.field_2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4b8._M_dataplus._M_p != paVar13) {
                operator_delete(local_4b8._M_dataplus._M_p,
                                local_4b8.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_438._M_dataplus._M_p != &local_438.field_2) {
                operator_delete(local_438._M_dataplus._M_p,
                                local_438.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4d8._M_dataplus._M_p != paVar12) {
                operator_delete(local_4d8._M_dataplus._M_p,
                                local_4d8.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_498._M_dataplus._M_p != &local_498.field_2) {
                operator_delete(local_498._M_dataplus._M_p,
                                local_498.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_418._M_dataplus._M_p != &local_418.field_2) {
                operator_delete(local_418._M_dataplus._M_p,
                                local_418.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_478._M_dataplus._M_p != &local_478.field_2) {
                operator_delete(local_478._M_dataplus._M_p,
                                local_478.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
                operator_delete(local_3d8._M_dataplus._M_p,
                                local_3d8.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
                operator_delete(local_3f8._M_dataplus._M_p,
                                local_3f8.field_2._M_allocated_capacity + 1);
              }
              local_4b8._M_dataplus._M_p = (pointer)paVar13;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_4b8,"false","");
              local_4d8._M_dataplus._M_p = (pointer)paVar12;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_4d8,
                         "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/io/write_matplotlib.cc"
                         ,"");
              std::__cxx11::stringbuf::str();
              base::AssertionFailed(&local_4b8,&local_4d8,0x47,&local_498);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_498._M_dataplus._M_p != &local_498.field_2) {
                operator_delete(local_498._M_dataplus._M_p,
                                local_498.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4d8._M_dataplus._M_p != paVar12) {
                operator_delete(local_4d8._M_dataplus._M_p,
                                local_4d8.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4b8._M_dataplus._M_p != paVar13) {
                operator_delete(local_4b8._M_dataplus._M_p,
                                local_4b8.field_2._M_allocated_capacity + 1);
              }
              prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error(prVar11,"this code should not be reached");
              __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
            poVar8 = (ostream *)std::ostream::operator<<(&local_230,iVar3);
            local_3b8[0] = (stringstream)0x2c;
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)local_3b8,1);
            poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
            local_3b8[0] = (stringstream)0x2c;
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)local_3b8,1);
            auVar16 = (**(code **)(*plVar1 + 8))(plVar1,local_4e8);
            if (auVar16._8_8_ != 0) {
              lVar15 = 0;
              do {
                (*mesh->_vptr_Mesh[5])(mesh,*(undefined8 *)(auVar16._0_8_ + lVar15));
                poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&local_230);
                local_3b8[0] = (stringstream)0x2c;
                std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)local_3b8,1);
                lVar15 = lVar15 + 8;
              } while (auVar16._8_8_ << 3 != lVar15);
            }
            local_3b8[0] = (stringstream)0xa;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_230,(char *)local_3b8,1);
          }
          free(local_450[0]);
          puVar5 = puVar5 + 1;
        } while (puVar5 != local_458);
      }
      uVar14 = (ulong)local_4dc;
    } while (local_4dc != 3);
  }
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = ___throw_bad_array_new_length;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void writeMatplotlib(const lf::mesh::Mesh &mesh, std::string filename) {
  using dim_t = lf::base::RefEl::dim_t;

  // append .csv to filename if necessary
  if (filename.compare(filename.size() - 4, 4, ".csv") != 0) {
    filename += ".csv";
  }

  std::ofstream file(filename);

  if (file.is_open()) {
    const dim_t dim_mesh = mesh.DimMesh();
    LF_VERIFY_MSG(dim_mesh == 2,
                  "write_matplotlib() only available for 2D meshes");

    // loop through all elements of every codimension
    for (int codim = 0; codim <= dim_mesh; ++codim) {
      for (const lf::mesh::Entity *obj : mesh.Entities(codim)) {
        const size_t obj_idx = mesh.Index(*obj);
        const lf::base::RefEl obj_ref_el = obj->RefEl();
        const lf::geometry::Geometry *obj_geo_ptr = obj->Geometry();
        const Eigen::MatrixXd vertices =
            obj_geo_ptr->Global(obj_ref_el.NodeCoords());

        switch (obj_ref_el) {
          case lf::base::RefEl::kPoint(): {
            file << codim << ',' << obj_idx << ',' << vertices(0, 0) << ','
                 << vertices(1, 0) << '\n';
            break;
          }
          case lf::base::RefEl::kSegment(): {
            file << codim << ',' << obj_idx << ',';
            // to access points of segment use SubEntities(1)
            for (const auto *sub : obj->SubEntities(codim)) {
              file << mesh.Index(*sub) << ',';
            }
            file << '\n';

            break;
          }
          case lf::base::RefEl::kTria():
          case lf::base::RefEl::kQuad(): {
            file << codim << ',' << obj_idx << ',';
            // to access points of cell use SubEntities(1)
            for (const auto *sub : obj->SubEntities(codim + 1)) {
              file << mesh.Index(*sub) << ',';
            }
            file << '\n';

            break;
          }
          default: {
            LF_VERIFY_MSG(false, "Error for object " + std::to_string(obj_idx) +
                                     " in codim " + std::to_string(codim) +
                                     " of type " + obj_ref_el.ToString());
            break;
          }
        }
      }
    }
  }
}